

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input-xkb.c
# Opt level: O0

uint32_t wpe_input_xkb_context_get_modifiers
                   (wpe_input_xkb_context *xkb_context,uint32_t depressed,uint32_t latched,
                   uint32_t locked,uint32_t group)

{
  byte bVar1;
  uint uVar2;
  undefined8 uVar3;
  uint local_3c;
  uint32_t retval;
  xkb_keymap *keymap;
  xkb_mod_mask_t mask;
  uint32_t group_local;
  uint32_t locked_local;
  uint32_t latched_local;
  uint32_t depressed_local;
  wpe_input_xkb_context *xkb_context_local;
  
  wpe_input_xkb_context_try_ensure_keymap(xkb_context);
  if (xkb_context->state == (xkb_state *)0x0) {
    xkb_context_local._4_4_ = 0;
  }
  else {
    xkb_state_update_mask(xkb_context->state,depressed,latched,locked,0,0,group);
    uVar2 = xkb_state_serialize_mods(xkb_context->state,3);
    uVar3 = xkb_state_get_keymap(xkb_context->state);
    local_3c = 0;
    bVar1 = xkb_keymap_mod_get_index(uVar3,"Shift");
    if ((uVar2 & 1 << (bVar1 & 0x1f)) != 0) {
      local_3c = 2;
    }
    bVar1 = xkb_keymap_mod_get_index(uVar3,"Control");
    if ((uVar2 & 1 << (bVar1 & 0x1f)) != 0) {
      local_3c = local_3c | 1;
    }
    bVar1 = xkb_keymap_mod_get_index(uVar3,"Mod1");
    if ((uVar2 & 1 << (bVar1 & 0x1f)) != 0) {
      local_3c = local_3c | 4;
    }
    bVar1 = xkb_keymap_mod_get_index(uVar3,"Meta");
    if ((uVar2 & 1 << (bVar1 & 0x1f)) != 0) {
      local_3c = local_3c | 8;
    }
    xkb_context_local._4_4_ = local_3c;
  }
  return xkb_context_local._4_4_;
}

Assistant:

uint32_t
wpe_input_xkb_context_get_modifiers(struct wpe_input_xkb_context* xkb_context, uint32_t depressed, uint32_t latched, uint32_t locked, uint32_t group)
{
    wpe_input_xkb_context_try_ensure_keymap(xkb_context);
    if (!xkb_context->state)
        return 0;

    xkb_state_update_mask(xkb_context->state, depressed, latched, locked, 0, 0, group);
    xkb_mod_mask_t mask = xkb_state_serialize_mods(xkb_context->state, XKB_STATE_MODS_DEPRESSED | XKB_STATE_MODS_LATCHED);

    struct xkb_keymap* keymap = xkb_state_get_keymap(xkb_context->state);
    uint32_t retval = 0;
    if (mask & (1 << xkb_keymap_mod_get_index(keymap, XKB_MOD_NAME_SHIFT)))
        retval |= wpe_input_keyboard_modifier_shift;
    if (mask & (1 << xkb_keymap_mod_get_index(keymap, XKB_MOD_NAME_CTRL)))
        retval |= wpe_input_keyboard_modifier_control;
    if (mask & (1 << xkb_keymap_mod_get_index(keymap, XKB_MOD_NAME_ALT)))
        retval |= wpe_input_keyboard_modifier_alt;
    if (mask & (1 << xkb_keymap_mod_get_index(keymap, "Meta")))
        retval |= wpe_input_keyboard_modifier_meta;
    return retval;
}